

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  cmValue cVar6;
  uint uVar7;
  pointer __rhs;
  allocator<char> local_2a9;
  string local_2a8;
  pointer local_288;
  string rp;
  string filePrefix;
  string localToplevel;
  string local_210;
  cmWorkingDirectory workdir;
  ostringstream cmCPackLog_msg;
  string local_50;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"   - packaging component: ");
  poVar3 = std::operator<<(poVar3,(string *)component);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x74,rp._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&rp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&rp);
  psVar4 = (string *)
           cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&localToplevel,(string *)psVar4);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&component->Name);
  std::__cxx11::string::append((string *)&localToplevel);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  cmWorkingDirectory::cmWorkingDirectory(&workdir,&localToplevel);
  if (workdir.ResultCode == 0) {
    filePrefix._M_dataplus._M_p = (pointer)&filePrefix.field_2;
    filePrefix._M_string_length = 0;
    filePrefix.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&rp);
    bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"CPACK_PACKAGE_FILE_NAME",&local_2a9);
      psVar4 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_210);
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      _cmCPackLog_msg = (pointer)psVar4->_M_string_length;
      rp._M_string_length = (size_type)&rp.field_2;
      rp._M_dataplus._M_p = (pointer)0x1;
      rp.field_2._M_local_buf[0] = '/';
      cmStrCat<>(&local_2a8,(cmAlphaNum *)&cmCPackLog_msg,(cmAlphaNum *)&rp);
      std::__cxx11::string::operator=((string *)&filePrefix,(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator<char> *)&rp);
    cVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (((cVar6.Value != (string *)0x0) && (1 < (cVar6.Value)->_M_string_length)) &&
       (*((cVar6.Value)->_M_dataplus)._M_p == '/')) {
      std::__cxx11::string::substr((ulong)&cmCPackLog_msg,(ulong)cVar6.Value);
      std::__cxx11::string::append((string *)&filePrefix);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::append((char *)&filePrefix);
    }
    local_288 = (component->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (component->Files).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != local_288; __rhs = __rhs + 1) {
      std::operator+(&rp,&filePrefix,__rhs);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Adding file: ");
      poVar3 = std::operator<<(poVar3,(string *)&rp);
      std::endl<char,std::char_traits<char>>(poVar3);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x8e,local_2a8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::__cxx11::string::string((string *)&local_50,(string *)&rp);
      cmArchiveWrite::Add(archive,&local_50,0,(char *)0x0,false);
      std::__cxx11::string::~string((string *)&local_50);
      if ((archive->Error)._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"ERROR while packaging files: ");
        std::__cxx11::string::string((string *)&local_2a8,(string *)&archive->Error);
        poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_2a8);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x93,local_2a8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&rp);
        break;
      }
      std::__cxx11::string::~string((string *)&rp);
    }
    uVar7 = (uint)(__rhs == local_288);
    std::__cxx11::string::~string((string *)&filePrefix);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Failed to change working directory to ");
    poVar3 = std::operator<<(poVar3,(string *)&localToplevel);
    poVar3 = std::operator<<(poVar3," : ");
    pcVar5 = strerror(workdir.ResultCode);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x7e,rp._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&rp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar7 = 0;
  }
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  std::__cxx11::string::~string((string *)&localToplevel);
  return uVar7;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << localToplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = cmStrCat(this->GetOption("CPACK_PACKAGE_FILE_NAME"), '/');
  }
  cmValue installPrefix = this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix->size() > 1 &&
      (*installPrefix)[0] == '/') {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix->substr(1);
    filePrefix += "/";
  }
  for (std::string const& file : component->Files) {
    std::string rp = filePrefix + file;
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
    archive.Add(rp, 0, nullptr, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "ERROR while packaging files: " << archive.GetError()
                                                    << std::endl);
      return 0;
    }
  }
  return 1;
}